

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TiledOutputFile::TiledOutputFile
          (TiledOutputFile *this,OStream *os,Header *header,int numThreads)

{
  string *psVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  undefined8 in_RSI;
  OStream *in_RDI;
  undefined1 unaff_retaddr;
  OStream *in_stack_00000008;
  Header *in_stack_00000010;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_00001a4e;
  undefined1 in_stack_00001a4f;
  Header *in_stack_00001a50;
  OutputStreamMutex *in_stack_fffffffffffffdc0;
  OStream *in_stack_fffffffffffffdc8;
  GenericOutputFile *in_stack_fffffffffffffdd0;
  Data *this_00;
  Header *in_stack_fffffffffffffe58;
  TiledOutputFile *in_stack_fffffffffffffe60;
  
  GenericOutputFile::GenericOutputFile((GenericOutputFile *)in_RDI);
  in_RDI->_vptr_OStream = (_func_int **)&PTR__TiledOutputFile_004ddc30;
  this_00 = (Data *)&in_RDI->_fileName;
  pvVar2 = operator_new(0x178);
  Data::Data(this_00,(int)((ulong)in_RDI >> 0x20));
  *(void **)&(this_00->header)._map._M_t._M_impl = pvVar2;
  psVar1 = &in_RDI->_fileName;
  puVar3 = (undefined8 *)operator_new(0x38);
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[6] = 0;
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdc0);
  psVar1->_M_string_length = (size_type)puVar3;
  (in_RDI->_fileName).field_2._M_local_buf[0] = '\0';
  Header::sanityCheck(in_stack_00001a50,(bool)in_stack_00001a4f,(bool)in_stack_00001a4e);
  *(undefined8 *)((in_RDI->_fileName)._M_string_length + 0x28) = in_RSI;
  *(undefined1 *)(*(long *)&in_RDI->_fileName + 0x3c) = 0;
  initialize(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  uVar4 = (**(code **)(**(long **)((in_RDI->_fileName)._M_string_length + 0x28) + 0x18))();
  *(undefined8 *)((in_RDI->_fileName)._M_string_length + 0x30) = uVar4;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(Header *)in_stack_fffffffffffffdc0
            );
  uVar5 = Header::writeTo(in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr);
  *(uint64_t *)(*(long *)&in_RDI->_fileName + 0x80) = uVar5;
  uVar5 = TileOffsets::writeTo((TileOffsets *)this_00,in_RDI);
  *(uint64_t *)(*(long *)&in_RDI->_fileName + 0x128) = uVar5;
  return;
}

Assistant:

TiledOutputFile::TiledOutputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os,
    const Header&                            header,
    int                                      numThreads)
    : _data (new Data (numThreads))
    , _streamData (new OutputStreamMutex ())
    , _deleteStream (false)
{
    try
    {
        header.sanityCheck (true);
        _streamData->os = &os;
        _data->multipart =
            false; // since we opened with one header we can't be multipart
        initialize (header);
        _streamData->currentPosition = _streamData->os->tellp ();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField (*_streamData->os, _data->header);
        _data->previewPosition = _data->header.writeTo (*_streamData->os, true);
        _data->tileOffsetsPosition =
            _data->tileOffsets.writeTo (*_streamData->os);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _streamData;
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot open image file "
            "\"" << os.fileName ()
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _streamData;
        delete _data;
        throw;
    }
}